

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O3

optional<pbrt::Point2<float>_> __thiscall
pbrt::PortalImageInfiniteLight::ImageFromRender
          (PortalImageInfiniteLight *this,Vector3f wRender,Float *duv_dw)

{
  undefined8 uVar1;
  ulong uVar2;
  undefined4 in_EDX;
  undefined4 extraout_EDX;
  undefined4 in_register_00000014;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar7 [64];
  undefined4 extraout_XMM0_Db;
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  float __x;
  float __y;
  optional<pbrt::Point2<float>_> oVar12;
  undefined1 extraout_var [60];
  
  auVar10._4_60_ = wRender._12_60_;
  auVar10._0_4_ = wRender.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar7._8_56_ = wRender._8_56_;
  auVar7._0_8_ = wRender.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar3 = auVar7._0_16_;
  auVar4 = vmovshdup_avx(auVar3);
  fVar6 = auVar4._0_4_;
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * duv_dw[0x39])),auVar3,ZEXT416((uint)duv_dw[0x38]))
  ;
  auVar9 = auVar10._0_16_;
  auVar4 = vfmadd231ss_fma(auVar4,auVar9,ZEXT416((uint)duv_dw[0x3a]));
  __x = auVar4._0_4_;
  if (__x <= 0.0) {
    (this->super_LightBase).renderFromLight.m.m[0][1] = 0.0;
    (this->super_LightBase).type = DeltaPosition;
    *(Float *)((long)((this->super_LightBase).renderFromLight.m.m + 0) + 0) = 0.0;
  }
  else {
    auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * duv_dw[0x33])),auVar3,
                             ZEXT416((uint)duv_dw[0x32]));
    auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * duv_dw[0x36])),auVar3,
                             ZEXT416((uint)duv_dw[0x35]));
    auVar4 = vfmadd231ss_fma(auVar4,auVar9,ZEXT416((uint)duv_dw[0x34]));
    auVar3 = vfmadd231ss_fma(auVar3,auVar9,ZEXT416((uint)duv_dw[0x37]));
    fVar6 = auVar4._0_4_;
    __y = auVar3._0_4_;
    if (CONCAT44(in_register_00000014,in_EDX) != 0) {
      *(float *)CONCAT44(in_register_00000014,in_EDX) =
           ((1.0 - fVar6 * fVar6) * 9.869605 * (1.0 - __y * __y)) / __x;
    }
    fVar6 = atan2f(fVar6,__x);
    auVar8._0_4_ = atan2f(__y,__x);
    auVar8._4_60_ = extraout_var;
    auVar9._4_4_ = extraout_XMM0_Db;
    auVar9._0_4_ = fVar6;
    auVar9._8_4_ = extraout_XMM0_Dc;
    auVar9._12_4_ = extraout_XMM0_Dd;
    auVar11._8_4_ = 0x3f800000;
    auVar11._0_8_ = 0x3f8000003f800000;
    auVar11._12_4_ = 0x3f800000;
    *(undefined1 *)((this->super_LightBase).renderFromLight.m.m[0] + 1) = 1;
    auVar4 = vinsertps_avx(auVar9,auVar8._0_16_,0x10);
    auVar3._8_4_ = 0x3fc90fdb;
    auVar3._0_8_ = 0x3fc90fdb3fc90fdb;
    auVar3._12_4_ = 0x3fc90fdb;
    auVar3 = vaddps_avx512vl(auVar4,auVar3);
    auVar4._8_4_ = 0x40490fdb;
    auVar4._0_8_ = 0x40490fdb40490fdb;
    auVar4._12_4_ = 0x40490fdb;
    auVar4 = vdivps_avx512vl(auVar3,auVar4);
    uVar2 = vcmpps_avx512vl(auVar4,ZEXT816(0) << 0x20,5);
    auVar4 = vminps_avx512vl(auVar11,auVar4);
    auVar5._4_4_ = (uint)((byte)(uVar2 >> 1) & 1) * auVar4._4_4_;
    auVar5._0_4_ = (uint)((byte)uVar2 & 1) * auVar4._0_4_;
    auVar5._8_4_ = (uint)((byte)(uVar2 >> 2) & 1) * auVar4._8_4_;
    auVar5._12_4_ = (uint)((byte)(uVar2 >> 3) & 1) * auVar4._12_4_;
    uVar1 = vmovlps_avx(auVar5);
    (this->super_LightBase).type = (int)uVar1;
    *(int *)((long)((this->super_LightBase).renderFromLight.m.m + 0) + 0) =
         (int)((ulong)uVar1 >> 0x20);
    in_EDX = extraout_EDX;
  }
  oVar12._8_4_ = in_EDX;
  oVar12.optionalValue =
       (aligned_storage_t<sizeof(pbrt::Point2<float>),_alignof(pbrt::Point2<float>)>)this;
  return oVar12;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<Point2f> ImageFromRender(Vector3f wRender,
                                            Float *duv_dw = nullptr) const {
        Vector3f w = portalFrame.ToLocal(wRender);
        if (w.z <= 0)
            return {};
        // Compute Jacobian determinant of mapping $\roman{d}(u,v)/\roman{d}\omega$ if
        // needed
        if (duv_dw)
            *duv_dw = Sqr(Pi) * (1 - Sqr(w.x)) * (1 - Sqr(w.y)) / w.z;

        Float alpha = std::atan2(w.x, w.z), beta = std::atan2(w.y, w.z);
        DCHECK(!IsNaN(alpha + beta));
        return Point2f(Clamp((alpha + Pi / 2) / Pi, 0, 1),
                       Clamp((beta + Pi / 2) / Pi, 0, 1));
    }